

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope_end.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::
scope_end_impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/upnp.cpp:481:35)>
::~scope_end_impl(scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_upnp_cpp:481:35)>
                  *this)

{
  socket_package *this_00;
  mutable_buffer local_68;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  _Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::reference_wrapper<libtorrent::aux::socket_package>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::socket_package_&,_const_boost::system::error_code_&,_unsigned_long)>
  local_40;
  
  if (this->m_armed == true) {
    this_00 = (this->m_fun).s;
    local_68.data_ = &this_00->buffer;
    local_68.size_ = 0x5dc;
    ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::upnp,void>
              ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)(this->m_fun).this);
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::upnp>,_std::reference_wrapper<libtorrent::aux::socket_package>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    .
    super__Tuple_impl<1UL,_std::reference_wrapper<libtorrent::aux::socket_package>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    .super__Head_base<1UL,_std::reference_wrapper<libtorrent::aux::socket_package>,_false>.
    _M_head_impl._M_data =
         (_Head_base<1UL,_std::reference_wrapper<libtorrent::aux::socket_package>,_false>)
         (this->m_fun).s;
    local_40._M_f = (offset_in_upnp_to_subr)upnp::on_reply;
    local_40._8_8_ = 0;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::upnp>,_std::reference_wrapper<libtorrent::aux::socket_package>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::upnp>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::upnp>,_std::reference_wrapper<libtorrent::aux::socket_package>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::upnp>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_50[0]._M_pi;
    local_58 = (element_type *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::asio::
    basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_receive_from<boost::asio::mutable_buffer,std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::reference_wrapper<libtorrent::aux::socket_package>,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::aux::socket_package&,boost::system::error_code_const&,unsigned_long)>>
              ((basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)this_00,&local_68,&this_00->remote,&local_40);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_40._M_bound_args.
                       super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::upnp>,_std::reference_wrapper<libtorrent::aux::socket_package>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                       .super__Head_base<0UL,_std::shared_ptr<libtorrent::upnp>,_false>._M_head_impl
                       .super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_50);
  }
  return;
}

Assistant:

~scope_end_impl() { if (m_armed) m_fun(); }